

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextProcessUndockWindow
               (ImGuiContext_conflict1 *ctx,ImGuiWindow_conflict *window,
               _Bool clear_persistent_docking_ref)

{
  byte *pbVar1;
  ImGuiDockNode *node;
  undefined1 auVar2 [16];
  ImVec2 IVar3;
  ImGuiID save_dock_id;
  
  node = (ImGuiDockNode *)(ctx->IO).MouseClickedTime[1];
  if (node == (ImGuiDockNode *)0x0) {
    *(undefined4 *)((ctx->IO).MouseClickedTime + 3) = 0;
  }
  else {
    save_dock_id = 0;
    if ((char)window == '\0') {
      save_dock_id = *(ImGuiID *)((ctx->IO).MouseClickedTime + 3);
    }
    DockNodeRemoveWindow(node,(ImGuiWindow_conflict *)ctx,save_dock_id);
  }
  (ctx->IO).ConfigDockingAlwaysTabBar = false;
  pbVar1 = (byte *)((long)&(ctx->IO).MouseClickedPos[2].y + 1);
  *pbVar1 = *pbVar1 & 0xf8;
  IVar3 = FixLargeWindowsWhenUndocking
                    ((ImVec2 *)((ctx->IO).KeyMap + 7),
                     *(ImGuiViewport **)&(ctx->IO).MouseDoubleClickTime);
  auVar2._8_4_ = IVar3.x;
  auVar2._0_4_ = IVar3.x;
  auVar2._4_4_ = IVar3.y;
  auVar2._12_4_ = IVar3.y;
  *(undefined1 (*) [16])((ctx->IO).KeyMap + 5) = auVar2;
  if (GImGui->SettingsDirtyTimer <= 0.0) {
    GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
  }
  return;
}

Assistant:

void ImGui::DockContextProcessUndockWindow(ImGuiContext* ctx, ImGuiWindow* window, bool clear_persistent_docking_ref)
{
    IMGUI_DEBUG_LOG_DOCKING("DockContextProcessUndockWindow window '%s', clear_persistent_docking_ref = %d\n", window->Name, clear_persistent_docking_ref);
    IM_UNUSED(ctx);
    if (window->DockNode)
        DockNodeRemoveWindow(window->DockNode, window, clear_persistent_docking_ref ? 0 : window->DockId);
    else
        window->DockId = 0;
    window->Collapsed = false;
    window->DockIsActive = false;
    window->DockNodeIsVisible = window->DockTabIsVisible = false;
    window->Size = window->SizeFull = FixLargeWindowsWhenUndocking(window->SizeFull, window->Viewport);

    MarkIniSettingsDirty();
}